

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O0

void __thiscall Clasp::Cli::ClaspCliConfig::reset(ClaspCliConfig *this)

{
  string *psVar1;
  long in_RDI;
  ClaspConfig *in_stack_00000080;
  
  psVar1 = (string *)std::__cxx11::string::operator=((string *)(in_RDI + 0x100),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 0xe0),psVar1);
  *(undefined1 *)(in_RDI + 0x120) = 0;
  ClaspConfig::reset(in_stack_00000080);
  return;
}

Assistant:

void ClaspCliConfig::reset() {
	config_[0] = config_[1] = "";
	validate_  = false;
	ClaspConfig::reset();
}